

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::calchullpbev
              (float3 *verts,int verts_count,int vlimit,Array<ConvexDecomposition::Plane> *planes,
              float bevangle)

{
  cbtHullTriangle *pcVar1;
  cbtHullTriangle *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  cbtHullTriangle **ppcVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var [60];
  undefined1 auVar14 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  Plane t;
  Plane t_00;
  float3 fVar19;
  float3 local_a0;
  int local_94;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  float3 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar15 [56];
  undefined1 auVar18 [60];
  
  planes->count = 0;
  local_88._0_4_ = bevangle;
  local_94 = verts_count;
  iVar5 = calchullgen(verts,verts_count,vlimit);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    local_90 = (float)local_88._0_4_ * 0.017453292;
    auVar11 = ZEXT464((uint)local_90);
    for (iVar5 = 0; iVar5 < (int)tris._8_4_; iVar5 = iVar5 + 1) {
      ppcVar7 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                          ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar5);
      auVar18 = in_ZMM1._4_60_;
      auVar15 = auVar11._8_56_;
      if (*ppcVar7 != (cbtHullTriangle *)0x0) {
        ppcVar7 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                            ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar5);
        pcVar1 = *ppcVar7;
        iVar6 = (pcVar1->super_int3).x;
        fVar19 = TriNormal(verts + iVar6,verts + (pcVar1->super_int3).y,
                           verts + (pcVar1->super_int3).z);
        auVar16._0_4_ = fVar19.z;
        auVar16._4_60_ = auVar18;
        auVar12._0_8_ = fVar19._0_8_;
        auVar12._8_56_ = auVar15;
        _local_58 = auVar12._0_16_;
        auVar9 = vmovshdup_avx(_local_58);
        local_68 = auVar16._0_16_;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * verts[iVar6].y)),_local_58,
                                 ZEXT416((uint)verts[iVar6].x));
        auVar9 = vfmadd231ss_fma(auVar9,local_68,ZEXT416((uint)verts[iVar6].z));
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar9 = vxorps_avx512vl(auVar9,auVar3);
        auVar9 = vinsertps_avx(local_68,auVar9,0x10);
        t._8_8_ = auVar9._0_8_;
        t.normal.x = (float)(int)auVar12._0_8_;
        t.normal.y = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
        in_ZMM1 = ZEXT1664(auVar9);
        auVar11._8_56_ = auVar15;
        auVar11._0_8_ = auVar12._0_8_;
        Array<ConvexDecomposition::Plane>::Add(planes,t);
        lVar8 = 0;
        while( true ) {
          auVar18 = in_ZMM1._4_60_;
          auVar15 = auVar11._8_56_;
          if (lVar8 == 3) break;
          iVar6 = (&(pcVar1->n).x)[lVar8];
          if (pcVar1->id <= iVar6) {
            ppcVar7 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar6);
            pcVar2 = *ppcVar7;
            fVar19 = TriNormal(verts + (pcVar2->super_int3).x,verts + (pcVar2->super_int3).y,
                               verts + (pcVar2->super_int3).z);
            auVar17._0_4_ = fVar19.z;
            auVar17._4_60_ = auVar18;
            auVar13._0_8_ = fVar19._0_8_;
            auVar13._8_56_ = auVar15;
            _local_48 = auVar13._0_16_;
            auVar9._0_4_ = local_58._0_4_ * fVar19.x;
            auVar9._4_4_ = local_58._4_4_ * fVar19.y;
            auVar9._8_4_ = local_58._8_4_ * auVar15._0_4_;
            auVar9._12_4_ = local_58._12_4_ * auVar15._4_4_;
            auVar9 = vmovshdup_avx(auVar9);
            auVar9 = vfmadd231ss_fma(auVar9,_local_48,_local_58);
            local_88 = vfmadd231ss_fma(auVar9,auVar17._0_16_,ZEXT416((uint)local_68._0_4_));
            local_8c = auVar17._0_4_;
            auVar11._0_4_ = cosf(local_90);
            auVar11._4_60_ = extraout_var;
            in_ZMM1 = ZEXT1664(local_88);
            if (local_88._0_4_ < auVar11._0_4_) {
              auVar10._0_4_ = (float)local_48._0_4_ + (float)local_58._0_4_;
              auVar10._4_4_ = (float)local_48._4_4_ + (float)local_58._4_4_;
              auVar10._8_4_ = fStack_40 + fStack_50;
              auVar10._12_4_ = fStack_3c + fStack_4c;
              auVar15 = ZEXT856(auVar10._8_8_);
              local_78.z = local_8c + (float)local_68._0_4_;
              local_78._0_8_ = vmovlps_avx(auVar10);
              fVar19 = normalize(&local_78);
              local_a0.z = fVar19.z;
              auVar14._0_8_ = fVar19._0_8_;
              auVar14._8_56_ = auVar15;
              local_a0._0_8_ = vmovlps_avx(auVar14._0_16_);
              iVar6 = maxdir<ConvexDecomposition::float3>(verts,local_94,&local_a0);
              auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_a0.y * verts[iVar6].y)),
                                       ZEXT416((uint)local_a0.x),ZEXT416((uint)verts[iVar6].x));
              auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)local_a0.z),
                                       ZEXT416((uint)verts[iVar6].z));
              auVar4._8_4_ = 0x80000000;
              auVar4._0_8_ = 0x8000000080000000;
              auVar4._12_4_ = 0x80000000;
              auVar9 = vxorps_avx512vl(auVar9,auVar4);
              auVar9 = vinsertps_avx(ZEXT416((uint)local_a0.z),auVar9,0x10);
              t_00._8_8_ = auVar9._0_8_;
              t_00.normal.x = local_a0.x;
              t_00.normal.y = local_a0.y;
              in_ZMM1 = ZEXT1664(auVar9);
              auVar11 = ZEXT864((ulong)local_a0._0_8_);
              Array<ConvexDecomposition::Plane>::Add(planes,t_00);
            }
          }
          lVar8 = lVar8 + 1;
        }
      }
    }
    for (iVar5 = 0; iVar5 < (int)tris._8_4_; iVar5 = iVar5 + 1) {
      ppcVar7 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                          ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar5);
      if (*ppcVar7 != (cbtHullTriangle *)0x0) {
        ppcVar7 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                            ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar5);
        pcVar1 = *ppcVar7;
        if (pcVar1 != (cbtHullTriangle *)0x0) {
          cbtHullTriangle::~cbtHullTriangle(pcVar1);
        }
        ::operator_delete(pcVar1,0x24);
      }
    }
    tris._8_4_ = 0;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int calchullpbev(float3 *verts,int verts_count,int vlimit, Array<Plane> &planes,float bevangle) 
{
	int i,j;
	planes.count=0;
	int rc = calchullgen(verts,verts_count,vlimit);
	if(!rc) return 0;
	for(i=0;i<tris.count;i++)if(tris[i])
	{
		Plane p;
		cbtHullTriangle *t = tris[i];
		p.normal = TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
		p.dist   = -dot(p.normal, verts[(*t)[0]]);
		planes.Add(p);
		for(j=0;j<3;j++)
		{
			if(t->n[j]<t->id) continue;
			cbtHullTriangle *s = tris[t->n[j]];
			REAL3 snormal = TriNormal(verts[(*s)[0]],verts[(*s)[1]],verts[(*s)[2]]);
			if(dot(snormal,p.normal)>=cos(bevangle*DEG2RAD)) continue;
			REAL3 n = normalize(snormal+p.normal);
			planes.Add(Plane(n,-dot(n,verts[maxdir(verts,verts_count,n)])));
		}
	}

	for(i=0;i<tris.count;i++)if(tris[i])
	{
		delete tris[i]; // delete tris[i];
	}
	tris.count=0;
	return 1;
}